

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

uint64_t __thiscall
helics::MessageFederateManager::pendingMessageCount(MessageFederateManager *this)

{
  int iVar1;
  shared_handle eptDat;
  shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff68;
  undefined1 local_70 [24];
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  *in_stack_ffffffffffffffa8;
  undefined1 local_40 [64];
  
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::lock_shared(in_stack_ffffffffffffffa8);
  gmlc::libguarded::
  shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::begin(in_stack_ffffffffffffff68);
  gmlc::libguarded::
  shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::end(in_stack_ffffffffffffff68);
  iVar1 = std::
          accumulate<std::_Deque_iterator<helics::MessageFederateManager::EndpointData,helics::MessageFederateManager::EndpointData_const&,helics::MessageFederateManager::EndpointData_const*>,int,helics::MessageFederateManager::pendingMessageCount()const::__0>
                    (local_40,local_70,0);
  gmlc::libguarded::
  shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
              *)0x27690b);
  return (long)iVar1;
}

Assistant:

uint64_t MessageFederateManager::pendingMessageCount() const
{
    auto eptDat = eptData.lock_shared();
    return std::accumulate(eptDat.begin(), eptDat.end(), 0, [](uint64_t count, const auto& ept) {
        return count + static_cast<uint64_t>(ept.messages.size());
    });
    /*
    uint64_t size{ 0 };
    for (const auto& mq : eptDat) {
        size = size + mq.messages.size();
    }
    return size;
    */
}